

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::reserve
          (ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this,size_t minSize)

{
  Section *pSVar1;
  unsigned_long uVar2;
  Section *pSVar3;
  ulong local_28;
  size_t i;
  Section *newObjects;
  size_t minSize_local;
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this_local;
  
  if (this->numAllocated < minSize) {
    uVar2 = getAlignedSize<16,unsigned_long>(minSize);
    if (8 < uVar2) {
      pSVar3 = (Section *)operator_new__(uVar2 << 4);
      for (local_28 = 0; local_28 < this->numActive; local_28 = local_28 + 1) {
        pSVar1 = this->items;
        pSVar3[local_28].start = pSVar1[local_28].start;
        pSVar3[local_28].end = pSVar1[local_28].end;
      }
      freeIfHeapAllocated(this);
      this->items = pSVar3;
    }
    this->numAllocated = uVar2;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }